

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.cpp
# Opt level: O1

SNMP_ERROR_STATUS __thiscall
OpaqueCallback::setTypeWithValue(OpaqueCallback *this,BER_CONTAINER *rawValue)

{
  SNMP_ERROR_STATUS SVar1;
  
  if (this->value == (uint8_t *)0x0) {
    return GEN_ERR;
  }
  if (rawValue[1]._vptr_BER_CONTAINER != (_func_int **)0x0) {
    SVar1 = WRONG_LENGTH;
    if ((int)rawValue[1]._type <= this->data_len) {
      memcpy(this->value,rawValue[1]._vptr_BER_CONTAINER,(long)this->data_len);
      SVar1 = NO_ERROR;
    }
    return SVar1;
  }
  return WRONG_VALUE;
}

Assistant:

SNMP_ERROR_STATUS OpaqueCallback::setTypeWithValue(BER_CONTAINER* rawValue){
    ASSERT_CALLBACK_SETTABLE();
    ASSERT_VALID_SETTABLE_VALUE(this->value);

    OpaqueType* val = static_cast<OpaqueType*>(rawValue);
    ASSERT_VALID_SETTING_VALUE(val->_value);
    if(val->_dataLength > this->data_len) return WRONG_LENGTH;
    memcpy(this->value, val->_value, this->data_len);

    return NO_ERROR;
}